

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Vector3 Vector3Normalize(Vector3 v)

{
  Vector3 VVar1;
  undefined4 local_3c;
  float ilength;
  float length;
  Vector3 v_local;
  undefined4 uStack_14;
  Vector3 result;
  
  local_3c = Vector3Length(v);
  if ((local_3c == 0.0) && (!NAN(local_3c))) {
    local_3c = 1.0;
  }
  local_3c = 1.0 / local_3c;
  v_local.z = v.x;
  uStack_14 = v.y;
  VVar1.z = v.z * local_3c;
  VVar1.x = v_local.z * local_3c;
  VVar1.y = uStack_14 * local_3c;
  return VVar1;
}

Assistant:

RMDEF Vector3 Vector3Normalize(Vector3 v)
{
    Vector3 result = v;

    float length, ilength;
    length = Vector3Length(v);
    if (length == 0.0f) length = 1.0f;
    ilength = 1.0f/length;

    result.x *= ilength;
    result.y *= ilength;
    result.z *= ilength;

    return result;
}